

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O2

void nva_rsprint(nva_regspace *regspace,nva_err err,uint64_t val)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  if (err == NVA_ERR_SUCCESS) {
    uVar2 = regspace->regsz - 1;
    if ((uVar2 < 8) && ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)) {
      printf(&DAT_001052f4 + *(int *)(&DAT_001052f4 + (ulong)uVar2 * 4),val);
      return;
    }
  }
  else {
    bVar1 = nva_rserrc(err);
    putchar(0x20);
    for (iVar3 = 0; iVar3 < regspace->regsz; iVar3 = iVar3 + 1) {
      printf("%c%c",(ulong)(uint)bVar1,(ulong)(uint)bVar1);
    }
  }
  return;
}

Assistant:

void nva_rsprint(struct nva_regspace *regspace, enum nva_err err, uint64_t val) {
	if (err) {
		int k;
		char ec = nva_rserrc(err);
		printf(" ");
		for (k = 0; k < regspace->regsz; k++)
			printf("%c%c", ec, ec);
	} else {
		switch (regspace->regsz) {
			case 1:
				printf (" %02"PRIx64, val);
				break;
			case 2:
				printf (" %04"PRIx64, val);
				break;
			case 4:
				printf (" %08"PRIx64, val);
				break;
			case 8:
				printf (" %016"PRIx64, val);
				break;
		}
	}
}